

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhash.h
# Opt level: O2

void mh_assoc_resize(mh_assoc_t *h,void *arg)

{
  mh_assoc_t *pmVar1;
  mh_int_t *pmVar2;
  ulong uVar3;
  assoc_val **ppaVar4;
  mh_int_t mVar5;
  mh_int_t mVar6;
  uint32_t uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  sbyte sVar11;
  byte bVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  mh_int_t mVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  assoc_val **local_48;
  
  pmVar1 = h->shadow;
  uVar14 = (ulong)h->resize_position;
  mVar16 = h->batch;
  do {
    if (h->n_buckets <= uVar14) {
      tnt_mem_free(h->p);
      tnt_mem_free(h->b);
      pmVar1->size = h->size;
      ppaVar4 = pmVar1->p;
      pmVar2 = pmVar1->b;
      mVar16 = pmVar1->resize_cnt;
      mVar5 = pmVar1->resize_position;
      mVar6 = pmVar1->batch;
      h->prime = pmVar1->prime;
      h->resize_cnt = mVar16;
      h->resize_position = mVar5;
      h->batch = mVar6;
      h->shadow = pmVar1->shadow;
      h->p = ppaVar4;
      h->b = pmVar2;
      mVar16 = pmVar1->n_dirty;
      mVar5 = pmVar1->size;
      mVar6 = pmVar1->upper_bound;
      h->n_buckets = pmVar1->n_buckets;
      h->n_dirty = mVar16;
      h->size = mVar5;
      h->upper_bound = mVar6;
      h->resize_cnt = h->resize_cnt + 1;
      return;
    }
    bVar22 = mVar16 == 0;
    mVar16 = mVar16 - 1;
    if (bVar22) {
      h->resize_position = (uint)uVar14;
      return;
    }
    if ((h->b[uVar14 >> 4] >> ((uint)uVar14 & 0xf) & 1) != 0) {
      ppaVar4 = h->p + uVar14;
      uVar7 = PMurHash32(0xd,((*ppaVar4)->key).id,((*ppaVar4)->key).id_len);
      uVar17 = pmVar1->n_buckets;
      uVar20 = (ulong)uVar7 % (ulong)uVar17;
      iVar13 = uVar7 % (uVar17 - 1) + 1;
      pmVar2 = pmVar1->b;
      while( true ) {
        uVar18 = (uint)uVar20 & 0xf;
        sVar11 = (sbyte)uVar18;
        uVar8 = 1 << sVar11;
        uVar3 = uVar20 >> 4;
        uVar10 = pmVar2[uVar3];
        uVar21 = uVar20;
        if ((uVar10 >> uVar18 & 1) == 0) break;
        local_48 = pmVar1->p;
        iVar9 = mh_cmp_eq(ppaVar4,local_48 + uVar20,pmVar2);
        uVar15 = uVar20;
        uVar19 = uVar3;
        uVar18 = uVar8;
        if (iVar9 != 0) goto LAB_00112198;
        pmVar2[uVar3] = 0x10000 << sVar11 | uVar10;
        uVar17 = pmVar1->n_buckets;
        uVar8 = (uint)uVar20 + iVar13;
        uVar10 = uVar17;
        if (uVar8 < uVar17) {
          uVar10 = 0;
        }
        uVar20 = (ulong)(uVar8 - uVar10);
      }
      do {
        do {
          bVar12 = (byte)uVar21 & 0xf;
          if (((pmVar2[uVar21 >> 4] >> bVar12) >> 0x10 & 1) == 0) {
            local_48 = pmVar1->p;
            uVar15 = uVar20;
            uVar19 = uVar3;
            uVar18 = uVar8;
            goto LAB_00112198;
          }
          uVar18 = (int)uVar21 + iVar13;
          uVar10 = 0 >> bVar12;
          if (uVar17 <= uVar18) {
            uVar10 = uVar17;
          }
          uVar18 = uVar18 - uVar10;
          uVar21 = (ulong)uVar18;
        } while ((pmVar2[uVar18 >> 4] >> (uVar18 & 0xf) & 1) == 0);
        local_48 = pmVar1->p;
        iVar9 = mh_cmp_eq(local_48 + uVar18,ppaVar4,pmVar2);
        uVar15 = (ulong)uVar18;
        uVar19 = (ulong)(uVar18 >> 4);
        uVar18 = 1 << ((byte)uVar18 & 0xf);
      } while (iVar9 == 0);
LAB_00112198:
      local_48[uVar15] = h->p[uVar14];
      pmVar1->b[uVar19] = pmVar1->b[uVar19] | uVar18;
      pmVar1->n_dirty = pmVar1->n_dirty + 1;
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void
_mh(resize)(struct _mh(t) *h,
	    mh_arg_t arg)
{
	struct _mh(t) *s = h->shadow;
#if MH_INCREMENTAL_RESIZE
	mh_int_t  batch = h->batch;
#endif
	mh_int_t i = 0;
	for (i = h->resize_position; i < h->n_buckets; i++) {
#if MH_INCREMENTAL_RESIZE
		if (batch-- == 0) {
			h->resize_position = i;
			return;
		}
#endif
		if (!mh_exist(h, i))
			continue;
		mh_int_t n = put_slot(s, mh_node(h, i), arg);
		s->p[n] = h->p[i];
		mh_setexist(s, n);
		s->n_dirty++;
	}
	MH_FREE(h->p);
	MH_FREE(h->b);
	s->size = h->size;
	memcpy(h, s, sizeof(*h));
	h->resize_cnt++;
}